

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar12;
  DataKey DVar13;
  int *piVar14;
  long lVar15;
  ulong uVar16;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  pointer pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_184;
  cpp_dec_float<50U,_int,_void> local_178;
  int local_13c;
  cpp_dec_float<50U,_int,_void> *local_138;
  pointer local_130;
  cpp_dec_float<50U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  uint local_48 [2];
  int local_40;
  byte local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  DVar13.info = 0;
  DVar13.idx = -1;
  pSVar12 = (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pnVar3 = (pSVar12->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_130 = (pSVar12->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  lVar15 = (long)(pSVar12->infeasibilitiesCo).super_IdxSet.num;
  if (0 < lVar15) {
    local_f0 = &this->last;
    uVar16 = lVar15 + 1;
    local_184 = -1;
    local_138 = &best->m_backend;
    do {
      pSVar12 = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      piVar14 = (pSVar12->infeasibilitiesCo).super_IdxSet.idx;
      iVar2 = piVar14[uVar16 - 2];
      local_178.data._M_elems._32_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
      local_178.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
      local_178.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_178.data._M_elems._24_5_ = SUB85(uVar4,0);
      local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_178.exp = pnVar3[iVar2].m_backend.exp;
      local_178.neg = pnVar3[iVar2].m_backend.neg;
      local_178.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_178.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      local_128.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_128.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_128.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_128.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_128.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_128.exp = (feastol->m_backend).exp;
      local_128.neg = (feastol->m_backend).neg;
      local_128.fpclass = (feastol->m_backend).fpclass;
      local_128.prec_elem = (feastol->m_backend).prec_elem;
      if ((local_128.data._M_elems[0] | local_128.fpclass) != cpp_dec_float_finite) {
        local_128.neg = (bool)(local_128.neg ^ 1);
      }
      tol = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)CONCAT31((int3)((local_128.data._M_elems[0] | local_128.fpclass) >> 8),
                               local_128.fpclass != cpp_dec_float_NaN);
      if (local_178.fpclass == cpp_dec_float_NaN || local_128.fpclass == cpp_dec_float_NaN) {
LAB_002c08c0:
        iVar11 = (pSVar12->infeasibilitiesCo).super_IdxSet.num;
        (pSVar12->infeasibilitiesCo).super_IdxSet.num = iVar11 + -1;
        piVar14[uVar16 - 2] = piVar14[(long)iVar11 + -1];
        (pSVar12->isInfeasibleCo).data[iVar2] = 0;
        uVar9 = local_178.data._M_elems._16_8_;
        uVar4 = local_178.data._M_elems._32_8_;
        uVar10 = local_178._48_8_;
      }
      else {
        local_13c = iVar2;
        iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_178,&local_128);
        if (-1 < iVar11) {
          pSVar12 = (this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver;
          piVar14 = (pSVar12->infeasibilitiesCo).super_IdxSet.idx;
          goto LAB_002c08c0;
        }
        uStack_50 = CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
        local_68 = (devexpr  [8])local_178.data._M_elems._0_8_;
        auStack_60[0] = local_178.data._M_elems[2];
        auStack_60[1] = local_178.data._M_elems[3];
        local_58[0] = local_178.data._M_elems[4];
        local_58[1] = local_178.data._M_elems[5];
        local_48[0] = local_178.data._M_elems[8];
        local_48[1] = local_178.data._M_elems[9];
        local_40 = local_178.exp;
        local_3c = local_178.neg;
        local_38 = local_178.fpclass;
        iStack_34 = local_178.prec_elem;
        local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_130[iVar2].m_backend.data;
        local_a8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_130[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_130[iVar2].m_backend.data + 0x10);
        local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        local_a8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((long)&local_130[iVar2].m_backend.data + 0x20);
        local_a8.m_backend.exp = local_130[iVar2].m_backend.exp;
        local_a8.m_backend.neg = local_130[iVar2].m_backend.neg;
        local_a8.m_backend.fpclass = local_130[iVar2].m_backend.fpclass;
        local_a8.m_backend.prec_elem = local_130[iVar2].m_backend.prec_elem;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (feastol->m_backend).exp;
        local_e8.m_backend.neg = (feastol->m_backend).neg;
        local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_128,local_68,&local_a8,&local_e8,tol);
        uVar4._0_4_ = local_128.data._M_elems[8];
        uVar4._4_4_ = local_128.data._M_elems[9];
        local_178.data._M_elems[8] = local_128.data._M_elems[8];
        local_178.data._M_elems[9] = local_128.data._M_elems[9];
        uVar9._0_4_ = local_128.data._M_elems[4];
        uVar9._4_4_ = local_128.data._M_elems[5];
        local_178.data._M_elems[4] = local_128.data._M_elems[4];
        local_178.data._M_elems[5] = local_128.data._M_elems[5];
        local_178.data._M_elems._24_5_ = local_128.data._M_elems._24_5_;
        local_178.data._M_elems[7]._1_3_ = local_128.data._M_elems[7]._1_3_;
        local_178.data._M_elems[0] = local_128.data._M_elems[0];
        local_178.data._M_elems[1] = local_128.data._M_elems[1];
        local_178.data._M_elems[2] = local_128.data._M_elems[2];
        local_178.data._M_elems[3] = local_128.data._M_elems[3];
        local_178.exp = local_128.exp;
        local_178.neg = local_128.neg;
        uVar10._0_4_ = local_128.fpclass;
        uVar10._4_4_ = local_128.prec_elem;
        local_178.fpclass = local_128.fpclass;
        local_178.prec_elem = local_128.prec_elem;
        if (((local_128.fpclass != cpp_dec_float_NaN) && (local_138->fpclass != cpp_dec_float_NaN))
           && (iVar11 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_178,local_138), uVar9 = local_178.data._M_elems._16_8_,
              uVar4 = local_178.data._M_elems._32_8_, uVar10 = local_178._48_8_, 0 < iVar11)) {
          pnVar17 = local_130 + iVar2;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 8)
               = local_178.data._M_elems._32_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 4)
               = local_178.data._M_elems._16_8_;
          *(ulong *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 6) =
               CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
          *(undefined8 *)(((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems =
               local_178.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<50U,_int,_void> *)&local_138->data)->data)._M_elems + 2)
               = local_178.data._M_elems._8_8_;
          local_138->exp = local_178.exp;
          local_138->neg = local_178.neg;
          local_138->fpclass = local_178.fpclass;
          local_138->prec_elem = local_178.prec_elem;
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 8) =
               *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x20);
          uVar5 = *(undefined8 *)&(pnVar17->m_backend).data;
          uVar6 = *(undefined8 *)((long)&(pnVar17->m_backend).data + 8);
          uVar7 = *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x18);
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 4) =
               *(undefined8 *)((long)&(pnVar17->m_backend).data + 0x10);
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 6) = uVar7;
          *(undefined8 *)(local_f0->m_backend).data._M_elems = uVar5;
          *(undefined8 *)((local_f0->m_backend).data._M_elems + 2) = uVar6;
          (this->last).m_backend.exp = (pnVar17->m_backend).exp;
          (this->last).m_backend.neg = (pnVar17->m_backend).neg;
          iVar8 = (pnVar17->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar17->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar8;
          local_184 = local_13c;
        }
      }
      local_178._48_8_ = uVar10;
      local_178.data._M_elems._32_8_ = uVar4;
      local_178.data._M_elems._16_8_ = uVar9;
      uVar16 = uVar16 - 1;
    } while (1 < uVar16);
    DVar13.info = 0;
    DVar13.idx = -1;
    if (-1 < local_184) {
      DVar13 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::id((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,local_184);
    }
  }
  return (SPxId)DVar13;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}